

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O3

int __thiscall TRootHandler_MNDX::LoadPackageNames(TRootHandler_MNDX *this)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  LPBYTE pBVar4;
  void *__dest;
  int iVar5;
  long lVar6;
  bool bFindResult;
  bool local_61;
  TMndxSearch local_60;
  
  local_60.pStruct40 = (TStruct40 *)0x0;
  local_60.szFoundPath = (char *)0x0;
  local_60.cchFoundPath = 0;
  local_60.FileNameIndex = 0;
  local_60.szSearchMask = "";
  local_60.cchSearchMask = 0;
  pBVar4 = (LPBYTE)malloc(0x600);
  (this->Packages).m_pItemArray = pBVar4;
  iVar5 = 0xc;
  if (pBVar4 != (LPBYTE)0x0) {
    (this->Packages).m_ItemCountMax = 0x40;
    (this->Packages).m_ItemCount = 0;
    (this->Packages).m_ItemSize = 0x18;
    while( true ) {
      local_61 = false;
      TMndxMarFile::DoSearch((this->MndxInfo).MarFiles[0],&local_60,&local_61);
      if (local_61 == false) break;
      __dest = malloc(local_60.cchFoundPath + 1);
      if (__dest == (void *)0x0) {
LAB_0011837d:
        iVar5 = 0xc;
        goto LAB_00118386;
      }
      bVar3 = CASC_ARRAY::EnlargeArray(&this->Packages,(this->Packages).m_ItemCount + 1);
      sVar2 = local_60.cchFoundPath;
      if (!bVar3) goto LAB_0011837d;
      pBVar4 = (this->Packages).m_pItemArray;
      sVar1 = (this->Packages).m_ItemCount;
      (this->Packages).m_ItemCount = sVar1 + 1;
      if (pBVar4 == (LPBYTE)0x0) goto LAB_0011837d;
      lVar6 = (this->Packages).m_ItemSize * sVar1;
      memcpy(__dest,local_60.szFoundPath,local_60.cchFoundPath);
      *(undefined1 *)((long)__dest + sVar2) = 0;
      *(void **)(pBVar4 + lVar6) = __dest;
      *(size_t *)(pBVar4 + lVar6 + 8) = sVar2;
      *(DWORD *)(pBVar4 + lVar6 + 0x10) = local_60.FileNameIndex;
    }
    iVar5 = 0;
  }
LAB_00118386:
  TMndxSearch::FreeStruct40(&local_60);
  return iVar5;
}

Assistant:

int LoadPackageNames()
    {
        TMndxSearch Search;
        int nError;

        // Prepare the file name search in the top level directory
        Search.SetSearchMask("", 0);

#ifdef _DEBUG
//      Search.SetSearchMask("mods/heroes.stormmod/base.stormmaps/maps/heroes/builtin/startingexperience/practicemode01.stormmap/dede.stormdata", 113);
#endif
        // Allocate initial name list structure
        nError = Packages.Create<MNDX_PACKAGE>(0x40);
        if(nError != ERROR_SUCCESS)
            return nError;

        // Keep searching as long as we find something
        for(;;)
        {
            PMNDX_PACKAGE pPackage;
            char * szFileName;
            bool bFindResult = false;

            // Search the next file name
            MndxInfo.MarFiles[0]->DoSearch(&Search, &bFindResult);
            if(bFindResult == false)
                break;

            // Create file name
            szFileName = CASC_ALLOC(char, Search.cchFoundPath + 1);
            if(szFileName == NULL)
                return ERROR_NOT_ENOUGH_MEMORY;

            // Insert the found name to the top level directory list
            pPackage = (PMNDX_PACKAGE)Packages.Insert(NULL, 1);
            if(pPackage == NULL)
                return ERROR_NOT_ENOUGH_MEMORY;

            // Fill the file name
            memcpy(szFileName, Search.szFoundPath, Search.cchFoundPath);
            szFileName[Search.cchFoundPath] = 0;

            // Fill the package structure
            pPackage->szFileName = szFileName;
            pPackage->nLength = Search.cchFoundPath;
            pPackage->nIndex = Search.FileNameIndex;
        }

        // Give the packages to the caller
        return ERROR_SUCCESS;
    }